

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)8>,false>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(uint *)((long)&local_28 + lVar1 * 4) = (uint)*(ushort *)((long)&local_18 + lVar1 * 2 + 8);
  }
  Push(this,(Value)local_28.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}